

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_sasl_init(AMQP_VALUE value,SASL_INIT_HANDLE *sasl_init_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  char *local_60;
  char *hostname;
  amqp_binary initial_response;
  char *mechanism;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  SASL_INIT_INSTANCE *sasl_init_instance;
  SASL_INIT_HANDLE *ppSStack_18;
  int result;
  SASL_INIT_HANDLE *sasl_init_handle_local;
  AMQP_VALUE value_local;
  
  ppSStack_18 = sasl_init_handle;
  sasl_init_handle_local = (SASL_INIT_HANDLE *)value;
  list_value = (AMQP_VALUE)sasl_init_create_internal();
  *ppSStack_18 = (SASL_INIT_HANDLE)list_value;
  if (*ppSStack_18 == (SASL_INIT_HANDLE)0x0) {
    sasl_init_instance._4_4_ = 0x2955;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)sasl_init_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      sasl_init_destroy(*ppSStack_18);
      sasl_init_instance._4_4_ = 0x295d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          sasl_init_instance._4_4_ = 0x2991;
        }
        else {
          pAVar3 = amqpvalue_get_list_item(pAStack_30,0);
          if (pAVar3 == (AMQP_VALUE)0x0) {
            sasl_init_destroy(*ppSStack_18);
            sasl_init_instance._4_4_ = 0x2973;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar3);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar3);
              sasl_init_destroy(*ppSStack_18);
              sasl_init_instance._4_4_ = 0x297d;
            }
            else {
              iVar1 = amqpvalue_get_symbol(pAVar3,(char **)&initial_response.length);
              if (iVar1 == 0) {
                amqpvalue_destroy(pAVar3);
                if ((1 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,1), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_binary(pAVar3,(amqp_binary *)&hostname), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    sasl_init_destroy(*ppSStack_18);
                    return 0x29a9;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                if ((2 < item_value._4_4_) &&
                   (pAVar3 = amqpvalue_get_list_item(pAStack_30,2), pAVar3 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar3);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_string(pAVar3,&local_60), iVar1 != 0)) {
                    amqpvalue_destroy(pAVar3);
                    sasl_init_destroy(*ppSStack_18);
                    return 0x29c6;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)sasl_init_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                sasl_init_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy(pAVar3);
                sasl_init_destroy(*ppSStack_18);
                sasl_init_instance._4_4_ = 0x2987;
              }
            }
          }
        }
      }
      else {
        sasl_init_instance._4_4_ = 0x2964;
      }
    }
  }
  return sasl_init_instance._4_4_;
}

Assistant:

int amqpvalue_get_sasl_init(AMQP_VALUE value, SASL_INIT_HANDLE* sasl_init_handle)
{
    int result;
    SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init_create_internal();
    *sasl_init_handle = sasl_init_instance;
    if (*sasl_init_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_init_destroy(*sasl_init_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* mechanism */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_init_destroy(*sasl_init_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_init_destroy(*sasl_init_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* mechanism;
                                if (amqpvalue_get_symbol(item_value, &mechanism) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* initial-response */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary initial_response;
                                if (amqpvalue_get_binary(item_value, &initial_response) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* hostname */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* hostname;
                                if (amqpvalue_get_string(item_value, &hostname) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_init_destroy(*sasl_init_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    sasl_init_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}